

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetPropertyNode::Evaluate
          (string *__return_storage_ptr__,TargetPropertyNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  undefined8 target_00;
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  Result RVar5;
  TargetType TVar6;
  size_type sVar7;
  const_reference pvVar8;
  cmMakefile *pcVar9;
  cmGlobalGenerator *this_00;
  ostream *poVar10;
  ulong uVar11;
  string *psVar12;
  char *pcVar13;
  basic_string_view<char,_std::char_traits<char>_> __y;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar14;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar15;
  char *local_988;
  char *local_960;
  char *local_938;
  char *local_910;
  char *local_8e8;
  char *local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  undefined1 local_700 [8];
  string linkedTargetsContent;
  string local_6c0;
  allocator<char> local_699;
  char *local_698;
  char *propContent_4;
  char *local_688;
  char *propContent_3;
  char *local_678;
  char *propContent_2;
  char *local_668;
  char *propContent_1;
  char *local_658;
  char *propContent;
  cmValue local_648;
  cmValue p;
  undefined1 local_638 [7];
  bool haveProp;
  string result;
  string local_5f8;
  cmListFileBacktrace local_5d8;
  undefined1 local_5c8 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  allocator<char> local_521;
  string local_520;
  string local_500;
  byte local_4dd;
  PolicyStatus local_4dc;
  undefined1 auStack_4d8 [3];
  bool evaluatingLinkLibraries;
  PolicyStatus polSt;
  char *local_4d0;
  byte local_4c1;
  undefined1 local_4c0 [7];
  bool isInterfaceProperty;
  string interfacePropertyName;
  string local_498;
  string local_478;
  allocator<char> local_451;
  string local_450;
  string local_430;
  allocator<char> local_409;
  string local_408;
  string local_3e8;
  _Base_ptr local_3c8;
  undefined1 local_3c0;
  allocator<char> local_3b1;
  string local_3b0;
  string local_390;
  allocator<char> local_369;
  string local_368;
  string local_348;
  _Base_ptr local_328;
  undefined1 local_320;
  _Base_ptr local_318;
  undefined1 local_310;
  string local_308;
  string local_2e8;
  undefined1 local_2c8 [8];
  ostringstream e_1;
  allocator<char> local_149;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_128;
  cmGeneratorTarget *local_118;
  cmGeneratorTarget *tgt;
  char *local_108;
  cmGeneratorTarget *local_100;
  char *local_f8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_f0;
  undefined4 local_e0;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  char *local_98;
  char *e;
  string propertyName;
  string targetName;
  cmGeneratorTarget *target;
  cmGeneratorExpressionDAGChecker *dagCheckerParent_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetPropertyNode *this_local;
  
  if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
       ::propertyNameValidator == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                   ::propertyNameValidator), iVar4 != 0)) {
    cmsys::RegularExpression::RegularExpression(&Evaluate::propertyNameValidator,"^[A-Za-z0-9_]+$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::propertyNameValidator,
                 &__dso_handle);
    __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                         ::propertyNameValidator);
  }
  targetName.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(propertyName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&e);
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(parameters);
  if (sVar7 == 2) {
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](parameters,0);
    std::__cxx11::string::operator=
              ((string *)(propertyName.field_2._M_local_buf + 8),(string *)pvVar8);
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](parameters,1);
    std::__cxx11::string::operator=((string *)&e,(string *)pvVar8);
    local_98 = GetErrorText((string *)((long)&propertyName.field_2 + 8),(string *)&e);
    if (local_98 != (char *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b8,content);
      pcVar13 = local_98;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar13,&local_d9);
      reportError(context,&local_b8,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_e0 = 1;
      goto LAB_008cc1ab;
    }
    local_f0 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&e);
    __y = (basic_string_view<char,_std::char_traits<char>_>)
          ::cm::operator____s("ALIASED_TARGET",0xe);
    local_108 = __y._M_str;
    tgt = (cmGeneratorTarget *)__y._M_len;
    local_100 = tgt;
    local_f8 = local_108;
    bVar1 = std::operator==(local_f0,__y);
    if (bVar1) {
      pcVar9 = cmLocalGenerator::GetMakefile(context->LG);
      bVar1 = cmMakefile::IsAlias(pcVar9,(string *)((long)&propertyName.field_2 + 8));
      if (bVar1) {
        local_118 = cmLocalGenerator::FindGeneratorTargetToUse
                              (context->LG,(string *)((long)&propertyName.field_2 + 8));
        if (local_118 != (cmGeneratorTarget *)0x0) {
          psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(local_118);
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar12);
          local_e0 = 1;
          goto LAB_008cc1ab;
        }
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_e0 = 1;
      goto LAB_008cc1ab;
    }
    local_128 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&e);
    local_148 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("ALIAS_GLOBAL",0xc);
    local_138 = local_148;
    bVar1 = std::operator==(local_128,local_148);
    if (bVar1) {
      pcVar9 = cmLocalGenerator::GetMakefile(context->LG);
      bVar1 = cmMakefile::IsAlias(pcVar9,(string *)((long)&propertyName.field_2 + 8));
      if (bVar1) {
        this_00 = cmLocalGenerator::GetGlobalGenerator(context->LG);
        bVar1 = cmGlobalGenerator::IsAlias(this_00,(string *)((long)&propertyName.field_2 + 8));
        pcVar13 = "FALSE";
        if (bVar1) {
          pcVar13 = "TRUE";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,pcVar13,&local_149);
        std::allocator<char>::~allocator(&local_149);
        local_e0 = 1;
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        local_e0 = 1;
      }
      goto LAB_008cc1ab;
    }
    targetName.field_2._8_8_ =
         cmLocalGenerator::FindGeneratorTargetToUse
                   (context->LG,(string *)((long)&propertyName.field_2 + 8));
    if ((cmGeneratorTarget *)targetName.field_2._8_8_ == (cmGeneratorTarget *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
      poVar10 = std::operator<<((ostream *)local_2c8,"Target \"");
      poVar10 = std::operator<<(poVar10,(string *)(propertyName.field_2._M_local_buf + 8));
      std::operator<<(poVar10,"\" not found.");
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_2e8,content);
      std::__cxx11::ostringstream::str();
      reportError(context,&local_2e8,&local_308);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_e0 = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
      goto LAB_008cc1ab;
    }
    pVar14 = std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::insert(&context->AllTargets,(value_type *)((long)&targetName.field_2 + 8));
    local_318 = (_Base_ptr)pVar14.first._M_node;
    local_310 = pVar14.second;
  }
  else {
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(parameters);
    if (sVar7 != 1) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_390,content);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,
                 "$<TARGET_PROPERTY:...> expression requires one or two parameters",&local_3b1);
      reportError(context,&local_390,&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::allocator<char>::~allocator(&local_3b1);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_e0 = 1;
      goto LAB_008cc1ab;
    }
    targetName.field_2._8_8_ = context->HeadTarget;
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](parameters,0);
    std::__cxx11::string::operator=((string *)&e,(string *)pvVar8);
    pVar15 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::insert(&context->SeenTargetProperties,(value_type *)&e);
    local_328 = (_Base_ptr)pVar15.first._M_node;
    local_320 = pVar15.second;
    context->HadHeadSensitiveCondition = true;
    if (targetName.field_2._8_8_ == 0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_348,content);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_368,
                 "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target.   Specify the target to read a property from using the $<TARGET_PROPERTY:tgt,prop> signature instead."
                 ,&local_369);
      reportError(context,&local_348,&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      std::allocator<char>::~allocator(&local_369);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_e0 = 1;
      goto LAB_008cc1ab;
    }
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                          "SOURCES");
  if (bVar1) {
    pVar14 = std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::insert(&context->SourceSensitiveTargets,(value_type *)((long)&targetName.field_2 + 8)
                     );
    local_3c8 = (_Base_ptr)pVar14.first._M_node;
    local_3c0 = pVar14.second;
  }
  uVar11 = std::__cxx11::string::empty();
  if ((uVar11 & 1) != 0) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_3e8,content);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,
               "$<TARGET_PROPERTY:...> expression requires a non-empty property name.",&local_409);
    reportError(context,&local_3e8,&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator(&local_409);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_e0 = 1;
    goto LAB_008cc1ab;
  }
  bVar1 = cmsys::RegularExpression::find(&Evaluate::propertyNameValidator,(string *)&e);
  if (!bVar1) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_430,content);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,"Property name not supported.",&local_451);
    reportError(context,&local_430,&local_450);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_e0 = 1;
    goto LAB_008cc1ab;
  }
  if (targetName.field_2._8_8_ == 0) {
    __assert_fail("target",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                  ,0x7ed,
                  "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                 );
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                          "LINKER_LANGUAGE");
  if (bVar1) {
    bVar1 = cmGeneratorTarget::LinkLanguagePropagatesToDependents
                      ((cmGeneratorTarget *)targetName.field_2._8_8_);
    if ((bVar1) && (dagCheckerParent != (cmGeneratorExpressionDAGChecker *)0x0)) {
      bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                        (dagCheckerParent,(cmGeneratorTarget *)0x0,ANY);
      if (!bVar1) {
        bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent);
        if (!bVar1) goto LAB_008cacd8;
      }
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_478,content);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_498,
                 "LINKER_LANGUAGE target property can not be used while evaluating link libraries for a static library"
                 ,(allocator<char> *)(interfacePropertyName.field_2._M_local_buf + 0xf));
      reportError(context,&local_478,&local_498);
      std::__cxx11::string::~string((string *)&local_498);
      std::allocator<char>::~allocator
                ((allocator<char> *)(interfacePropertyName.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_e0 = 1;
    }
    else {
LAB_008cacd8:
      cmGeneratorTarget::GetLinkerLanguage
                (__return_storage_ptr__,(cmGeneratorTarget *)targetName.field_2._8_8_,
                 &context->Config);
      local_e0 = 1;
    }
    goto LAB_008cc1ab;
  }
  std::__cxx11::string::string((string *)local_4c0);
  local_4c1 = 0;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                          "INCLUDE_DIRECTORIES");
  if (bVar1) {
    std::__cxx11::string::operator=((string *)local_4c0,"INTERFACE_INCLUDE_DIRECTORIES");
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                            "INTERFACE_INCLUDE_DIRECTORIES");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_4c0,"INTERFACE_INCLUDE_DIRECTORIES");
      local_4c1 = 1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &e,"SYSTEM_INCLUDE_DIRECTORIES");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_4c0,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES");
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&e,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES");
        if (bVar1) {
          std::__cxx11::string::operator=
                    ((string *)local_4c0,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES");
          local_4c1 = 1;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&e,"COMPILE_DEFINITIONS");
          if (bVar1) {
            std::__cxx11::string::operator=((string *)local_4c0,"INTERFACE_COMPILE_DEFINITIONS");
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&e,"INTERFACE_COMPILE_DEFINITIONS");
            if (bVar1) {
              std::__cxx11::string::operator=((string *)local_4c0,"INTERFACE_COMPILE_DEFINITIONS");
              local_4c1 = 1;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&e,"COMPILE_OPTIONS");
              if (bVar1) {
                std::__cxx11::string::operator=((string *)local_4c0,"INTERFACE_COMPILE_OPTIONS");
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&e,"INTERFACE_COMPILE_OPTIONS");
                if (bVar1) {
                  std::__cxx11::string::operator=((string *)local_4c0,"INTERFACE_COMPILE_OPTIONS");
                  local_4c1 = 1;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&e,"AUTOUIC_OPTIONS");
                  if (bVar1) {
                    std::__cxx11::string::operator=((string *)local_4c0,"INTERFACE_AUTOUIC_OPTIONS")
                    ;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&e,"INTERFACE_AUTOUIC_OPTIONS");
                    if (bVar1) {
                      std::__cxx11::string::operator=
                                ((string *)local_4c0,"INTERFACE_AUTOUIC_OPTIONS");
                      local_4c1 = 1;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&e,"SOURCES");
                      if (bVar1) {
                        std::__cxx11::string::operator=((string *)local_4c0,"INTERFACE_SOURCES");
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&e,"INTERFACE_SOURCES");
                        if (bVar1) {
                          std::__cxx11::string::operator=((string *)local_4c0,"INTERFACE_SOURCES");
                          local_4c1 = 1;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"COMPILE_FEATURES");
                          if (bVar1) {
                            std::__cxx11::string::operator=
                                      ((string *)local_4c0,"INTERFACE_COMPILE_FEATURES");
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"INTERFACE_COMPILE_FEATURES");
                            if (bVar1) {
                              std::__cxx11::string::operator=
                                        ((string *)local_4c0,"INTERFACE_COMPILE_FEATURES");
                              local_4c1 = 1;
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"LINK_OPTIONS");
                              if (bVar1) {
                                std::__cxx11::string::operator=
                                          ((string *)local_4c0,"INTERFACE_LINK_OPTIONS");
                              }
                              else {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"INTERFACE_LINK_OPTIONS");
                                if (bVar1) {
                                  std::__cxx11::string::operator=
                                            ((string *)local_4c0,"INTERFACE_LINK_OPTIONS");
                                  local_4c1 = 1;
                                }
                                else {
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"LINK_DIRECTORIES");
                                  if (bVar1) {
                                    std::__cxx11::string::operator=
                                              ((string *)local_4c0,"INTERFACE_LINK_DIRECTORIES");
                                  }
                                  else {
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"INTERFACE_LINK_DIRECTORIES");
                                    if (bVar1) {
                                      std::__cxx11::string::operator=
                                                ((string *)local_4c0,"INTERFACE_LINK_DIRECTORIES");
                                      local_4c1 = 1;
                                    }
                                    else {
                                      bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"LINK_DEPENDS");
                                      if (bVar1) {
                                        std::__cxx11::string::operator=
                                                  ((string *)local_4c0,"INTERFACE_LINK_DEPENDS");
                                      }
                                      else {
                                        bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"INTERFACE_LINK_DEPENDS");
                                        if (bVar1) {
                                          std::__cxx11::string::operator=
                                                    ((string *)local_4c0,"INTERFACE_LINK_DEPENDS");
                                          local_4c1 = 1;
                                        }
                                        else {
                                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"PRECOMPILE_HEADERS");
                                          if (bVar1) {
                                            std::__cxx11::string::operator=
                                                      ((string *)local_4c0,
                                                       "INTERFACE_PRECOMPILE_HEADERS");
                                          }
                                          else {
                                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"INTERFACE_PRECOMPILE_HEADERS");
                                            if (bVar1) {
                                              std::__cxx11::string::operator=
                                                        ((string *)local_4c0,
                                                         "INTERFACE_PRECOMPILE_HEADERS");
                                              local_4c1 = 1;
                                            }
                                            else {
                                              _auStack_4d8 = (string_view)
                                                             std::__cxx11::string::
                                                             operator_cast_to_basic_string_view
                                                                       ((string *)&e);
                                              bVar1 = cmHasLiteralPrefix<21ul>
                                                                (_auStack_4d8,
                                                                 (char (*) [21])
                                                                 "COMPILE_DEFINITIONS_");
                                              if (bVar1) {
                                                local_4dc = cmLocalGenerator::GetPolicyStatus
                                                                      (context->LG,CMP0043);
                                                if ((local_4dc == WARN) || (local_4dc == OLD)) {
                                                  std::__cxx11::string::operator=
                                                            ((string *)local_4c0,
                                                             "INTERFACE_COMPILE_DEFINITIONS");
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_4dd = 0;
  if (dagCheckerParent != (cmGeneratorExpressionDAGChecker *)0x0) {
    bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression(dagCheckerParent);
    if (bVar1) goto LAB_008cb619;
    bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingPICExpression(dagCheckerParent);
    if (bVar1) goto LAB_008cb619;
    bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                      (dagCheckerParent,(cmGeneratorTarget *)0x0,ANY);
    if (!bVar1) {
      bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingIncludeDirectories(dagCheckerParent);
      bVar1 = true;
      if (!bVar2) {
        bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingSystemIncludeDirectories
                          (dagCheckerParent);
        bVar1 = true;
        if (!bVar2) {
          bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingCompileDefinitions(dagCheckerParent);
          bVar1 = true;
          if (!bVar2) {
            bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingCompileOptions(dagCheckerParent);
            bVar1 = true;
            if (!bVar2) {
              bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingAutoUicOptions(dagCheckerParent);
              bVar1 = true;
              if (!bVar2) {
                bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent);
                bVar1 = true;
                if (!bVar2) {
                  bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingCompileFeatures
                                    (dagCheckerParent);
                  bVar1 = true;
                  if (!bVar2) {
                    bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkOptions(dagCheckerParent)
                    ;
                    bVar1 = true;
                    if (!bVar2) {
                      bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDirectories
                                        (dagCheckerParent);
                      bVar1 = true;
                      if (!bVar2) {
                        bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDepends
                                          (dagCheckerParent);
                        bVar1 = true;
                        if (!bVar2) {
                          bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingPrecompileHeaders
                                            (dagCheckerParent);
                          bVar1 = true;
                          if (!bVar2) {
                            bVar1 = false;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (!bVar1) {
        __assert_fail("CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD( ASSERT_TRANSITIVE_PROPERTY_METHOD) false"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                      ,0x825,
                      "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                     );
      }
      goto LAB_008cb619;
    }
    local_4dd = 1;
    uVar11 = std::__cxx11::string::empty();
    if ((uVar11 & 1) != 0) goto LAB_008cb619;
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_500,content);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_520,
               "$<TARGET_PROPERTY:...> expression in link libraries evaluation depends on target property which is transitive over the link libraries, creating a recursion."
               ,&local_521);
    reportError(context,&local_500,&local_520);
    std::__cxx11::string::~string((string *)&local_520);
    std::allocator<char>::~allocator(&local_521);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_e0 = 1;
    goto LAB_008cc18f;
  }
LAB_008cb619:
  if ((local_4c1 & 1) != 0) {
    cmGeneratorTarget::EvaluateInterfaceProperty
              ((string *)&dagChecker.CheckResult,(cmGeneratorTarget *)targetName.field_2._8_8_,
               (string *)&e,context,dagCheckerParent,Usage);
    cmGeneratorExpression::StripEmptyListElements
              (__return_storage_ptr__,(string *)&dagChecker.CheckResult);
    std::__cxx11::string::~string((string *)&dagChecker.CheckResult);
    local_e0 = 1;
    goto LAB_008cc18f;
  }
  cmListFileBacktrace::cmListFileBacktrace(&local_5d8,&context->Backtrace);
  target_00 = targetName.field_2._8_8_;
  std::__cxx11::string::string((string *)&local_5f8,(string *)&e);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_5c8,&local_5d8,(cmGeneratorTarget *)target_00,
             &local_5f8,content,dagCheckerParent);
  std::__cxx11::string::~string((string *)&local_5f8);
  cmListFileBacktrace::~cmListFileBacktrace(&local_5d8);
  RVar5 = cmGeneratorExpressionDAGChecker::Check((cmGeneratorExpressionDAGChecker *)local_5c8);
  switch(RVar5) {
  case DAG:
  case ALREADY_SEEN:
  default:
    std::__cxx11::string::string((string *)local_638);
    p.Value._7_1_ = 0;
    local_648 = cmGeneratorTarget::GetProperty
                          ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e);
    bVar1 = cmValue::operator_cast_to_bool(&local_648);
    if (!bVar1) {
      if ((local_4dd & 1) == 0) goto LAB_008cb8d4;
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      goto LAB_008cc157;
    }
    psVar12 = cmValue::operator*[abi_cxx11_(&local_648);
    std::__cxx11::string::operator=((string *)local_638,(string *)psVar12);
    p.Value._7_1_ = 1;
LAB_008cb8d4:
    if ((p.Value._7_1_ & 1) == 0) {
      bVar1 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)targetName.field_2._8_8_);
      if (!bVar1) {
        TVar6 = cmGeneratorTarget::GetType((cmGeneratorTarget *)targetName.field_2._8_8_);
        if (TVar6 != INTERFACE_LIBRARY) {
          bVar1 = cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty
                            ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                             &context->Config);
          if (bVar1) {
            context->HadContextSensitiveCondition = true;
            bVar1 = cmGeneratorTarget::GetLinkInterfaceDependentBoolProperty
                              ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                               &context->Config);
            if (bVar1) {
              local_8c0 = "1";
            }
            else {
              local_8c0 = "0";
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,local_8c0,
                       (allocator<char> *)((long)&propContent + 7));
            std::allocator<char>::~allocator((allocator<char> *)((long)&propContent + 7));
          }
          else {
            bVar1 = cmGeneratorTarget::IsLinkInterfaceDependentStringProperty
                              ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                               &context->Config);
            if (bVar1) {
              context->HadContextSensitiveCondition = true;
              local_658 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                                    ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                                     &context->Config);
              local_8e8 = local_658;
              if (local_658 == (char *)0x0) {
                local_8e8 = "";
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,local_8e8,
                         (allocator<char> *)((long)&propContent_1 + 7));
              std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_1 + 7));
            }
            else {
              bVar1 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                                 &context->Config);
              if (bVar1) {
                context->HadContextSensitiveCondition = true;
                local_668 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                      ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                                       &context->Config);
                local_910 = local_668;
                if (local_668 == (char *)0x0) {
                  local_910 = "";
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)__return_storage_ptr__,local_910,
                           (allocator<char> *)((long)&propContent_2 + 7));
                std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_2 + 7));
              }
              else {
                bVar1 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                  ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                                   &context->Config);
                if (!bVar1) goto LAB_008cbd4f;
                context->HadContextSensitiveCondition = true;
                local_678 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                      ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                                       &context->Config);
                local_938 = local_678;
                if (local_678 == (char *)0x0) {
                  local_938 = "";
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)__return_storage_ptr__,local_938,
                           (allocator<char> *)((long)&propContent_3 + 7));
                std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_3 + 7));
              }
            }
          }
          goto LAB_008cc157;
        }
      }
    }
LAB_008cbd4f:
    bVar1 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)targetName.field_2._8_8_);
    if ((bVar1) || (dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0)) {
LAB_008cbfbe:
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        cmGeneratorExpressionNode::EvaluateDependentExpression
                  ((string *)((long)&linkedTargetsContent.field_2 + 8),(string *)local_638,
                   context->LG,context,(cmGeneratorTarget *)targetName.field_2._8_8_,
                   (cmGeneratorExpressionDAGChecker *)local_5c8,
                   (cmGeneratorTarget *)targetName.field_2._8_8_);
        cmGeneratorExpression::StripEmptyListElements
                  (&local_6c0,(string *)((long)&linkedTargetsContent.field_2 + 8));
        std::__cxx11::string::operator=((string *)local_638,(string *)&local_6c0);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::__cxx11::string::~string((string *)(linkedTargetsContent.field_2._M_local_buf + 8));
        getLinkedTargetsContent
                  ((string *)local_700,(cmGeneratorTarget *)targetName.field_2._8_8_,
                   (string *)local_4c0,context,(cmGeneratorExpressionDAGChecker *)local_5c8);
        uVar11 = std::__cxx11::string::empty();
        if ((uVar11 & 1) == 0) {
          cVar3 = std::__cxx11::string::empty();
          pcVar13 = ";";
          if (cVar3 != '\0') {
            pcVar13 = "";
          }
          std::operator+(&local_720,pcVar13,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_700);
          std::__cxx11::string::operator+=((string *)local_638,(string *)&local_720);
          std::__cxx11::string::~string((string *)&local_720);
        }
        std::__cxx11::string::~string((string *)local_700);
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_638);
    }
    else {
      bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                        (dagCheckerParent,(cmGeneratorTarget *)0x0,ANY);
      if (bVar1) goto LAB_008cbfbe;
      bVar1 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                        ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,&context->Config
                        );
      if (bVar1) {
        context->HadContextSensitiveCondition = true;
        local_688 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                              ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                               &context->Config);
        local_960 = local_688;
        if (local_688 == (char *)0x0) {
          local_960 = "";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,local_960,
                   (allocator<char> *)((long)&propContent_4 + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_4 + 7));
      }
      else {
        bVar1 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                          ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                           &context->Config);
        if (!bVar1) goto LAB_008cbfbe;
        context->HadContextSensitiveCondition = true;
        local_698 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                              ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                               &context->Config);
        local_988 = local_698;
        if (local_698 == (char *)0x0) {
          local_988 = "";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,local_988,&local_699);
        std::allocator<char>::~allocator(&local_699);
      }
    }
LAB_008cc157:
    local_e0 = 1;
    std::__cxx11::string::~string((string *)local_638);
    break;
  case SELF_REFERENCE:
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              ((string *)((long)&result.field_2 + 8),content);
    cmGeneratorExpressionDAGChecker::ReportError
              ((cmGeneratorExpressionDAGChecker *)local_5c8,context,
               (string *)((long)&result.field_2 + 8));
    std::__cxx11::string::~string((string *)(result.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_e0 = 1;
    break;
  case CYCLIC_REFERENCE:
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_e0 = 1;
  }
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_5c8);
LAB_008cc18f:
  std::__cxx11::string::~string((string *)local_4c0);
LAB_008cc1ab:
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)(propertyName.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagCheckerParent) const override
  {
    static cmsys::RegularExpression propertyNameValidator("^[A-Za-z0-9_]+$");

    cmGeneratorTarget const* target = nullptr;
    std::string targetName;
    std::string propertyName;

    if (parameters.size() == 2) {
      targetName = parameters[0];
      propertyName = parameters[1];

      if (const char* e = GetErrorText(targetName, propertyName)) {
        reportError(context, content->GetOriginalExpression(), e);
        return std::string();
      }
      if (propertyName == "ALIASED_TARGET"_s) {
        if (context->LG->GetMakefile()->IsAlias(targetName)) {
          if (cmGeneratorTarget* tgt =
                context->LG->FindGeneratorTargetToUse(targetName)) {
            return tgt->GetName();
          }
        }
        return std::string();
      }
      if (propertyName == "ALIAS_GLOBAL"_s) {
        if (context->LG->GetMakefile()->IsAlias(targetName)) {
          return context->LG->GetGlobalGenerator()->IsAlias(targetName)
            ? "TRUE"
            : "FALSE";
        }
        return std::string();
      }
      target = context->LG->FindGeneratorTargetToUse(targetName);

      if (!target) {
        std::ostringstream e;
        e << "Target \"" << targetName << "\" not found.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
      context->AllTargets.insert(target);

    } else if (parameters.size() == 1) {
      target = context->HeadTarget;
      propertyName = parameters[0];

      // Keep track of the properties seen while processing.
      // The evaluation of the LINK_LIBRARIES generator expressions
      // will check this to ensure that properties have one consistent
      // value for all evaluations.
      context->SeenTargetProperties.insert(propertyName);

      context->HadHeadSensitiveCondition = true;
      if (!target) {
        reportError(
          context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  "
          "It may not be used with add_custom_command or add_custom_target.  "
          " "
          "Specify the target to read a property from using the "
          "$<TARGET_PROPERTY:tgt,prop> signature instead.");
        return std::string();
      }
    } else {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires one or two parameters");
      return std::string();
    }

    if (propertyName == "SOURCES") {
      context->SourceSensitiveTargets.insert(target);
    }

    if (propertyName.empty()) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires a non-empty property "
        "name.");
      return std::string();
    }

    if (!propertyNameValidator.find(propertyName)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Property name not supported.");
      return std::string();
    }

    assert(target);

    if (propertyName == "LINKER_LANGUAGE") {
      if (target->LinkLanguagePropagatesToDependents() && dagCheckerParent &&
          (dagCheckerParent->EvaluatingLinkLibraries() ||
           dagCheckerParent->EvaluatingSources())) {
        reportError(
          context, content->GetOriginalExpression(),
          "LINKER_LANGUAGE target property can not be used while evaluating "
          "link libraries for a static library");
        return std::string();
      }
      return target->GetLinkerLanguage(context->Config);
    }

    std::string interfacePropertyName;
    bool isInterfaceProperty = false;

#define POPULATE_INTERFACE_PROPERTY_NAME(prop)                                \
  if (propertyName == #prop) {                                                \
    interfacePropertyName = "INTERFACE_" #prop;                               \
  } else if (propertyName == "INTERFACE_" #prop) {                            \
    interfacePropertyName = "INTERFACE_" #prop;                               \
    isInterfaceProperty = true;                                               \
  } else

    CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(POPULATE_INTERFACE_PROPERTY_NAME)
    // Note that the above macro terminates with an else
    /* else */ if (cmHasLiteralPrefix(propertyName, "COMPILE_DEFINITIONS_")) {
      cmPolicies::PolicyStatus polSt =
        context->LG->GetPolicyStatus(cmPolicies::CMP0043);
      if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD) {
        interfacePropertyName = "INTERFACE_COMPILE_DEFINITIONS";
      }
    }
#undef POPULATE_INTERFACE_PROPERTY_NAME

    bool evaluatingLinkLibraries = false;

    if (dagCheckerParent) {
      if (dagCheckerParent->EvaluatingGenexExpression() ||
          dagCheckerParent->EvaluatingPICExpression()) {
        // No check required.
      } else if (dagCheckerParent->EvaluatingLinkLibraries()) {
        evaluatingLinkLibraries = true;
        if (!interfacePropertyName.empty()) {
          reportError(
            context, content->GetOriginalExpression(),
            "$<TARGET_PROPERTY:...> expression in link libraries "
            "evaluation depends on target property which is transitive "
            "over the link libraries, creating a recursion.");
          return std::string();
        }
      } else {
#define ASSERT_TRANSITIVE_PROPERTY_METHOD(METHOD) dagCheckerParent->METHOD() ||
        assert(CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD(
          ASSERT_TRANSITIVE_PROPERTY_METHOD) false); // NOLINT(clang-tidy)
#undef ASSERT_TRANSITIVE_PROPERTY_METHOD
      }
    }

    if (isInterfaceProperty) {
      return cmGeneratorExpression::StripEmptyListElements(
        target->EvaluateInterfaceProperty(propertyName, context,
                                          dagCheckerParent));
    }

    cmGeneratorExpressionDAGChecker dagChecker(
      context->Backtrace, target, propertyName, content, dagCheckerParent);

    switch (dagChecker.Check()) {
      case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
        dagChecker.ReportError(context, content->GetOriginalExpression());
        return std::string();
      case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE:
        // No error. We just skip cyclic references.
        return std::string();
      case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
        // We handle transitive properties above.  For non-transitive
        // properties we accept repeats anyway.
      case cmGeneratorExpressionDAGChecker::DAG:
        break;
    }

    std::string result;
    bool haveProp = false;
    if (cmValue p = target->GetProperty(propertyName)) {
      result = *p;
      haveProp = true;
    } else if (evaluatingLinkLibraries) {
      return std::string();
    }

    if (!haveProp && !target->IsImported() &&
        target->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
      if (target->IsLinkInterfaceDependentBoolProperty(propertyName,
                                                       context->Config)) {
        context->HadContextSensitiveCondition = true;
        return target->GetLinkInterfaceDependentBoolProperty(propertyName,
                                                             context->Config)
          ? "1"
          : "0";
      }
      if (target->IsLinkInterfaceDependentStringProperty(propertyName,
                                                         context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentStringProperty(propertyName,
                                                          context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
    }

    if (!target->IsImported() && dagCheckerParent &&
        !dagCheckerParent->EvaluatingLinkLibraries()) {
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
    }

    if (!interfacePropertyName.empty()) {
      result = cmGeneratorExpression::StripEmptyListElements(
        this->EvaluateDependentExpression(result, context->LG, context, target,
                                          &dagChecker, target));
      std::string linkedTargetsContent = getLinkedTargetsContent(
        target, interfacePropertyName, context, &dagChecker);
      if (!linkedTargetsContent.empty()) {
        result += (result.empty() ? "" : ";") + linkedTargetsContent;
      }
    }
    return result;
  }